

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u16 cellSizePtr(MemPage *pPage,u8 *pCell)

{
  u8 *puVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  u8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar8 = pCell + pPage->childPtrSize;
  bVar2 = pCell[pPage->childPtrSize];
  uVar5 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    uVar5 = bVar2 & 0x7f;
    uVar10 = 0;
    do {
      lVar4 = uVar10 + 1;
      uVar9 = uVar10 + 1;
      uVar5 = puVar8[lVar4] & 0x7f | uVar5 << 7;
      if (6 < uVar10) break;
      uVar10 = uVar9;
    } while ((char)puVar8[lVar4] < '\0');
    puVar8 = puVar8 + uVar9;
  }
  if (pPage->intKey == '\0') {
    iVar6 = (int)puVar8 + 1;
  }
  else {
    uVar10 = 1;
    do {
      uVar9 = uVar10 + 1;
      if (8 < uVar10) break;
      puVar1 = puVar8 + uVar10;
      uVar10 = uVar9;
    } while ((char)*puVar1 < '\0');
    iVar6 = (int)puVar8 + (int)uVar9;
  }
  if (pPage->maxLocal < uVar5) {
    uVar3 = pPage->minLocal;
    uVar5 = (uVar5 - uVar3) % (pPage->pBt->usableSize - 4) + (uint)uVar3;
    if (pPage->maxLocal < uVar5) {
      uVar5 = (uint)uVar3;
    }
    uVar7 = (iVar6 - (int)pCell) + uVar5 + 4;
  }
  else {
    uVar5 = uVar5 + (iVar6 - (int)pCell);
    uVar7 = 4;
    if (4 < uVar5) {
      uVar7 = uVar5;
    }
  }
  return (u16)uVar7;
}

Assistant:

static u16 cellSizePtr(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell + pPage->childPtrSize; /* For looping over bytes of pCell */
  u8 *pEnd;                                /* End mark for a varint */
  u32 nSize;                               /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  if( pPage->intKey ){
    /* pIter now points at the 64-bit integer key value, a variable length 
    ** integer. The following block moves pIter to point at the first byte
    ** past the end of the key value. */
    pEnd = &pIter[9];
    while( (*pIter++)&0x80 && pIter<pEnd );
  }
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}